

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# block_splitter.cc
# Opt level: O1

void brotli::RefineEntropyCodes<brotli::Histogram<256>,unsigned_char>
               (uchar *data,size_t length,size_t stride,
               vector<brotli::Histogram<256>,_std::allocator<brotli::Histogram<256>_>_> *vec)

{
  pointer pHVar1;
  ulong uVar2;
  size_t sVar3;
  long lVar4;
  ulong uVar5;
  ulong uVar6;
  ulong uVar7;
  size_t sVar8;
  uint uVar9;
  bool bVar10;
  Histogram<256> sample;
  int local_440 [256];
  long local_40;
  undefined8 local_38;
  
  pHVar1 = (vec->
           super__Vector_base<brotli::Histogram<256>,_std::allocator<brotli::Histogram<256>_>_>).
           _M_impl.super__Vector_impl_data._M_start;
  uVar2 = ((long)(vec->
                 super__Vector_base<brotli::Histogram<256>,_std::allocator<brotli::Histogram<256>_>_>
                 )._M_impl.super__Vector_impl_data._M_finish - (long)pHVar1) / 0x410;
  uVar7 = (length * 2) / stride + uVar2 + 99;
  if (uVar7 != uVar7 % uVar2) {
    sVar8 = length;
    if (stride < length) {
      sVar8 = stride;
    }
    uVar9 = 7;
    uVar6 = 0;
    do {
      memset(local_440,0,0x408);
      local_38 = 0x7ff0000000000000;
      if (stride < length) {
        bVar10 = uVar9 == 0;
        uVar9 = uVar9 * 0x41a7;
        if (bVar10) {
          uVar9 = 1;
        }
        uVar5 = (ulong)uVar9 % (1 - (stride - length));
        sVar3 = stride;
      }
      else {
        uVar5 = 0;
        sVar3 = length;
      }
      lVar4 = local_40 + sVar3;
      local_40 = lVar4;
      if (sVar3 != 0) {
        sVar3 = 0;
        do {
          local_440[data[sVar3 + uVar5]] = local_440[data[sVar3 + uVar5]] + 1;
          sVar3 = sVar3 + 1;
        } while (sVar8 != sVar3);
      }
      pHVar1[uVar6 % uVar2].total_count_ = pHVar1[uVar6 % uVar2].total_count_ + lVar4;
      lVar4 = 0;
      do {
        pHVar1[uVar6 % uVar2].data_[lVar4] = pHVar1[uVar6 % uVar2].data_[lVar4] + local_440[lVar4];
        lVar4 = lVar4 + 1;
      } while (lVar4 != 0x100);
      uVar6 = uVar6 + 1;
    } while (uVar6 < uVar7 - uVar7 % uVar2);
  }
  return;
}

Assistant:

void RefineEntropyCodes(const DataType* data, size_t length,
                        size_t stride,
                        std::vector<HistogramType>* vec) {
  size_t iters =
      kIterMulForRefining * length / stride + kMinItersForRefining;
  unsigned int seed = 7;
  iters = ((iters + vec->size() - 1) / vec->size()) * vec->size();
  for (size_t iter = 0; iter < iters; ++iter) {
    HistogramType sample;
    RandomSample(&seed, data, length, stride, &sample);
    size_t ix = iter % vec->size();
    (*vec)[ix].AddHistogram(sample);
  }
}